

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping0.c
# Opt level: O0

int mapping0_inverse(vorbis_block *vb,vorbis_info_mapping *l)

{
  _func_void_ptr_vorbis_block_ptr_vorbis_look_floor_ptr *p_Var1;
  vorbis_look_floor *pvVar2;
  _func_int_vorbis_block_ptr_vorbis_look_residue_ptr_float_ptr_ptr_int_ptr_int *p_Var3;
  vorbis_look_residue *pvVar4;
  float *pfVar5;
  _func_int_vorbis_block_ptr_vorbis_look_floor_ptr_void_ptr_float_ptr *p_Var6;
  mdct_lookup *init;
  int iVar7;
  int *piVar8;
  int *piVar9;
  vorbis_info_mapping *pvVar10;
  long lVar11;
  void *pvVar12;
  ulong uVar13;
  undefined8 uStack_c0;
  void *pvStack_b8;
  long local_b0;
  float *local_a8;
  float *pcm_1;
  float *pfStack_98;
  int submap_1;
  float *pcm;
  float ang;
  float mag;
  float *pcmA;
  float *pcmM;
  int ch_in_bundle;
  int submap;
  void **floormemo;
  int *nonzero;
  int *zerobundle;
  float **pcmbundle;
  long n;
  int j;
  int i;
  vorbis_info_mapping0 *info;
  private_state *b;
  codec_setup_info *ci;
  vorbis_info *vi;
  vorbis_dsp_state *vd;
  vorbis_info_mapping *l_local;
  vorbis_block *vb_local;
  
  vi = (vorbis_info *)vb->vd;
  ci = (codec_setup_info *)((vorbis_dsp_state *)vi)->vi;
  b = (private_state *)ci->mode_param[1];
  info = (vorbis_info_mapping0 *)((vorbis_dsp_state *)vi)->backend_state;
  pcmbundle = (float **)(long)b->window[vb->W * 2 + -2];
  vb->pcmend = b->window[vb->W * 2 + -2];
  zerobundle = (int *)((long)&pvStack_b8 -
                      ((long)*(int *)((long)ci->blocksizes + 4) * 8 + 0xfU & 0xfffffffffffffff0));
  nonzero = (int *)((long)zerobundle -
                   ((long)*(int *)((long)ci->blocksizes + 4) * 4 + 0xfU & 0xfffffffffffffff0));
  floormemo = (void **)((long)nonzero -
                       ((long)*(int *)((long)ci->blocksizes + 4) * 4 + 0xfU & 0xfffffffffffffff0));
  lVar11 = (long)floormemo -
           ((long)*(int *)((long)ci->blocksizes + 4) * 8 + 0xfU & 0xfffffffffffffff0);
  _ch_in_bundle = lVar11;
  _j = (int *)l;
  vd = (vorbis_dsp_state *)l;
  l_local = vb;
  for (n._4_4_ = 0; pvVar10 = l_local, n._4_4_ < *(int *)((long)ci->blocksizes + 4);
      n._4_4_ = n._4_4_ + 1) {
    pcmM._4_4_ = _j[(long)n._4_4_ + 1];
    p_Var1 = _floor_P[*(int *)((long)(b[5].fft_look + 5) +
                              (long)_j[(long)pcmM._4_4_ + 0x101] * 4 + 8)]->inverse1;
    pvVar2 = *(vorbis_look_floor **)
              (*(long *)(info->chmuxlist + 0x15) + (long)_j[(long)pcmM._4_4_ + 0x101] * 8);
    *(undefined8 *)(lVar11 + -8) = 0x2d235e;
    pvVar12 = (*p_Var1)((vorbis_block *)pvVar10,pvVar2);
    *(void **)(_ch_in_bundle + (long)n._4_4_ * 8) = pvVar12;
    if (*(long *)(_ch_in_bundle + (long)n._4_4_ * 8) == 0) {
      *(undefined4 *)((long)floormemo + (long)n._4_4_ * 4) = 0;
    }
    else {
      *(undefined4 *)((long)floormemo + (long)n._4_4_ * 4) = 1;
    }
    pvVar12 = *(void **)(*l_local + (long)n._4_4_ * 8);
    uVar13 = (long)pcmbundle << 2;
    *(undefined8 *)(lVar11 + -8) = 0x2d23bd;
    memset(pvVar12,0,uVar13 >> 1);
  }
  for (n._4_4_ = 0; n._4_4_ < _j[0x121]; n._4_4_ = n._4_4_ + 1) {
    if ((*(int *)((long)floormemo + (long)_j[(long)n._4_4_ + 0x122] * 4) != 0) ||
       (*(int *)((long)floormemo + (long)_j[(long)n._4_4_ + 0x222] * 4) != 0)) {
      *(undefined4 *)((long)floormemo + (long)_j[(long)n._4_4_ + 0x122] * 4) = 1;
      *(undefined4 *)((long)floormemo + (long)_j[(long)n._4_4_ + 0x222] * 4) = 1;
    }
  }
  for (n._4_4_ = 0; pvVar10 = l_local, piVar9 = zerobundle, piVar8 = nonzero, n._4_4_ < *_j;
      n._4_4_ = n._4_4_ + 1) {
    pcmM._0_4_ = 0;
    for (n._0_4_ = 0; iVar7 = (int)pcmM, (int)n < *(int *)((long)ci->blocksizes + 4);
        n._0_4_ = (int)n + 1) {
      if (_j[(long)(int)n + 1] == n._4_4_) {
        if (*(int *)((long)floormemo + (long)(int)n * 4) == 0) {
          nonzero[(int)pcmM] = 0;
        }
        else {
          nonzero[(int)pcmM] = 1;
        }
        *(undefined8 *)(zerobundle + (long)(int)pcmM * 2) =
             *(undefined8 *)(*l_local + (long)(int)n * 8);
        pcmM._0_4_ = (int)pcmM + 1;
      }
    }
    p_Var3 = _residue_P[b[9].window[(long)_j[(long)n._4_4_ + 0x111] + -2]]->inverse;
    pvVar4 = *(vorbis_look_residue **)
              (*(long *)(info->chmuxlist + 0x17) + (long)_j[(long)n._4_4_ + 0x111] * 8);
    *(undefined8 *)(lVar11 + -8) = 0x2d2555;
    (*p_Var3)((vorbis_block *)pvVar10,pvVar4,(float **)piVar9,piVar8,iVar7);
  }
  n._4_4_ = _j[0x121];
  while (n._4_4_ = n._4_4_ + -1, -1 < n._4_4_) {
    pcmA = *(float **)(*l_local + (long)_j[(long)n._4_4_ + 0x122] * 8);
    _ang = *(long *)(*l_local + (long)_j[(long)n._4_4_ + 0x222] * 8);
    for (n._0_4_ = 0; local_b0 = (long)(int)n, local_b0 < (long)pcmbundle / 2; n._0_4_ = (int)n + 1)
    {
      pcm._4_4_ = pcmA[(int)n];
      pcm._0_4_ = *(float *)(_ang + (long)(int)n * 4);
      if (pcm._4_4_ <= 0.0) {
        if (pcm._0_4_ <= 0.0) {
          *(float *)(_ang + (long)(int)n * 4) = pcm._4_4_;
          pcmA[(int)n] = pcm._4_4_ - pcm._0_4_;
        }
        else {
          pcmA[(int)n] = pcm._4_4_;
          *(float *)(_ang + (long)(int)n * 4) = pcm._4_4_ + pcm._0_4_;
        }
      }
      else if (pcm._0_4_ <= 0.0) {
        *(float *)(_ang + (long)(int)n * 4) = pcm._4_4_;
        pcmA[(int)n] = pcm._4_4_ + pcm._0_4_;
      }
      else {
        pcmA[(int)n] = pcm._4_4_;
        *(float *)(_ang + (long)(int)n * 4) = pcm._4_4_ - pcm._0_4_;
      }
    }
  }
  for (n._4_4_ = 0; pvVar10 = l_local, n._4_4_ < *(int *)((long)ci->blocksizes + 4);
      n._4_4_ = n._4_4_ + 1) {
    pfVar5 = *(float **)(*l_local + (long)n._4_4_ * 8);
    pcm_1._4_4_ = _j[(long)n._4_4_ + 1];
    p_Var6 = _floor_P[*(int *)((long)(b[5].fft_look + 5) +
                              (long)_j[(long)pcm_1._4_4_ + 0x101] * 4 + 8)]->inverse2;
    pvVar2 = *(vorbis_look_floor **)
              (*(long *)(info->chmuxlist + 0x15) + (long)_j[(long)pcm_1._4_4_ + 0x101] * 8);
    pvVar12 = *(void **)(_ch_in_bundle + (long)n._4_4_ * 8);
    pfStack_98 = pfVar5;
    *(undefined8 *)(lVar11 + -8) = 0x2d27dd;
    (*p_Var6)((vorbis_block *)pvVar10,pvVar2,pvVar12,pfVar5);
  }
  for (n._4_4_ = 0; n._4_4_ < *(int *)((long)ci->blocksizes + 4); n._4_4_ = n._4_4_ + 1) {
    pfVar5 = *(float **)(*l_local + (long)n._4_4_ * 8);
    init = (mdct_lookup *)
           **(undefined8 **)(info->chmuxlist + *(long *)((long)l_local + 0x38) * 2 + 3);
    local_a8 = pfVar5;
    *(undefined8 *)(lVar11 + -8) = 0x2d283b;
    mdct_backward(init,pfVar5,pfVar5);
  }
  return 0;
}

Assistant:

static int mapping0_inverse(vorbis_block *vb,vorbis_info_mapping *l){
  vorbis_dsp_state     *vd=vb->vd;
  vorbis_info          *vi=vd->vi;
  codec_setup_info     *ci=vi->codec_setup;
  private_state        *b=vd->backend_state;
  vorbis_info_mapping0 *info=(vorbis_info_mapping0 *)l;

  int                   i,j;
  long                  n=vb->pcmend=ci->blocksizes[vb->W];

  float **pcmbundle=alloca(sizeof(*pcmbundle)*vi->channels);
  int    *zerobundle=alloca(sizeof(*zerobundle)*vi->channels);

  int   *nonzero  =alloca(sizeof(*nonzero)*vi->channels);
  void **floormemo=alloca(sizeof(*floormemo)*vi->channels);

  /* recover the spectral envelope; store it in the PCM vector for now */
  for(i=0;i<vi->channels;i++){
    int submap=info->chmuxlist[i];
    floormemo[i]=_floor_P[ci->floor_type[info->floorsubmap[submap]]]->
      inverse1(vb,b->flr[info->floorsubmap[submap]]);
    if(floormemo[i])
      nonzero[i]=1;
    else
      nonzero[i]=0;
    memset(vb->pcm[i],0,sizeof(*vb->pcm[i])*n/2);
  }

  /* channel coupling can 'dirty' the nonzero listing */
  for(i=0;i<info->coupling_steps;i++){
    if(nonzero[info->coupling_mag[i]] ||
       nonzero[info->coupling_ang[i]]){
      nonzero[info->coupling_mag[i]]=1;
      nonzero[info->coupling_ang[i]]=1;
    }
  }

  /* recover the residue into our working vectors */
  for(i=0;i<info->submaps;i++){
    int ch_in_bundle=0;
    for(j=0;j<vi->channels;j++){
      if(info->chmuxlist[j]==i){
        if(nonzero[j])
          zerobundle[ch_in_bundle]=1;
        else
          zerobundle[ch_in_bundle]=0;
        pcmbundle[ch_in_bundle++]=vb->pcm[j];
      }
    }

    _residue_P[ci->residue_type[info->residuesubmap[i]]]->
      inverse(vb,b->residue[info->residuesubmap[i]],
              pcmbundle,zerobundle,ch_in_bundle);
  }

  /* channel coupling */
  for(i=info->coupling_steps-1;i>=0;i--){
    float *pcmM=vb->pcm[info->coupling_mag[i]];
    float *pcmA=vb->pcm[info->coupling_ang[i]];

    for(j=0;j<n/2;j++){
      float mag=pcmM[j];
      float ang=pcmA[j];

      if(mag>0)
        if(ang>0){
          pcmM[j]=mag;
          pcmA[j]=mag-ang;
        }else{
          pcmA[j]=mag;
          pcmM[j]=mag+ang;
        }
      else
        if(ang>0){
          pcmM[j]=mag;
          pcmA[j]=mag+ang;
        }else{
          pcmA[j]=mag;
          pcmM[j]=mag-ang;
        }
    }
  }

  /* compute and apply spectral envelope */
  for(i=0;i<vi->channels;i++){
    float *pcm=vb->pcm[i];
    int submap=info->chmuxlist[i];
    _floor_P[ci->floor_type[info->floorsubmap[submap]]]->
      inverse2(vb,b->flr[info->floorsubmap[submap]],
               floormemo[i],pcm);
  }

  /* transform the PCM data; takes PCM vector, vb; modifies PCM vector */
  /* only MDCT right now.... */
  for(i=0;i<vi->channels;i++){
    float *pcm=vb->pcm[i];
    mdct_backward(b->transform[vb->W][0],pcm,pcm);
  }

  /* all done! */
  return(0);
}